

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_copy_fflags_text_len(archive_entry *entry,char *flags,size_t flags_length)

{
  undefined1 auVar1 [16];
  char *__s;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t __n;
  unsigned_long *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  undefined1 auVar10 [16];
  byte *local_60;
  undefined1 local_58 [16];
  
  archive_mstring_copy_mbs_len(&entry->ae_fflags_text,flags,flags_length);
  sVar4 = flags_length;
  local_60 = (byte *)flags;
  while (((pbVar5 = (byte *)(flags + flags_length), sVar4 != 0 &&
          (pbVar5 = local_60, (ulong)*local_60 < 0x2d)) &&
         ((0x100100000200U >> ((ulong)*local_60 & 0x3f) & 1) != 0))) {
    local_60 = local_60 + 1;
    sVar4 = sVar4 - 1;
  }
  local_60 = pbVar5;
  local_58 = (undefined1  [16])0x0;
  pbVar5 = (byte *)0x0;
  do {
    if (sVar4 == 0) {
      entry->ae_fflags_set = local_58._0_8_;
      entry->ae_fflags_clear = local_58._8_8_;
      return (char *)pbVar5;
    }
    lVar9 = -sVar4;
    pbVar7 = local_60;
    while ((pbVar8 = local_60 + sVar4, lVar9 != 0 &&
           ((0x2c < (ulong)*pbVar7 ||
            (pbVar8 = pbVar7, (0x100100000200U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))))) {
      pbVar7 = pbVar7 + 1;
      lVar9 = lVar9 + 1;
    }
    __n = (long)pbVar8 - (long)local_60;
    for (puVar6 = &fileflags[0].set; __s = ((flag *)(puVar6 + -2))->name, __s != (char *)0x0;
        puVar6 = puVar6 + 4) {
      sVar3 = strlen(__s);
      if ((__n == sVar3) && (iVar2 = bcmp(local_60,__s,__n), iVar2 == 0)) {
        auVar1 = *(undefined1 (*) [16])puVar6;
        auVar10._0_8_ = auVar1._8_8_;
        auVar10._8_4_ = auVar1._0_4_;
        auVar10._12_4_ = auVar1._4_4_;
LAB_001116b2:
        local_58 = local_58 | auVar10;
        break;
      }
      if ((__n == sVar3 - 2) && (iVar2 = bcmp(local_60,__s + 2,__n), iVar2 == 0)) {
        auVar10 = *(undefined1 (*) [16])puVar6;
        goto LAB_001116b2;
      }
    }
    if (__s == (char *)0x0 && pbVar5 == (byte *)0x0) {
      pbVar5 = local_60;
    }
    pbVar7 = pbVar8 + -lVar9;
    sVar4 = -lVar9;
    while (((local_60 = pbVar7, sVar4 != 0 && (local_60 = pbVar8, (ulong)*pbVar8 < 0x2d)) &&
           ((0x100100000200U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
      pbVar8 = pbVar8 + 1;
      sVar4 = sVar4 - 1;
    }
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text_len(struct archive_entry *entry,
    const char *flags, size_t flags_length)
{
	archive_mstring_copy_mbs_len(&entry->ae_fflags_text, flags, flags_length);
	return (ae_strtofflags(flags, flags_length,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}